

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_identity(lyout *out,lys_ident *ident,int *first)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *local_68;
  lys_module *mod;
  int j;
  int f;
  int *first_local;
  lys_ident *ident_local;
  lyout *out_local;
  
  mod._4_4_ = 1;
  bVar4 = false;
  if (first != (int *)0x0) {
    bVar4 = *first != 0;
  }
  pcVar3 = ",";
  if (bVar4) {
    pcVar3 = "";
  }
  _j = first;
  first_local = (int *)ident;
  ident_local = (lys_ident *)out;
  ly_print(out,"%s\"%s\":{",pcVar3,ident->name);
  if (*(char *)((long)first_local + 0x1f) != '\0') {
    ly_print((lyout *)ident_local,"\"bases\":[");
    mod._4_4_ = 0;
    for (mod._0_4_ = 0; (int)mod < (int)(uint)*(byte *)((long)first_local + 0x1f);
        mod._0_4_ = (int)mod + 1) {
      lVar1 = *(long *)(*(long *)(*(long *)(first_local + 0xe) + (long)(int)mod * 8) + 0x30);
      pcVar3 = "";
      if ((int)mod != 0) {
        pcVar3 = ",";
      }
      pcVar2 = "";
      if (*(char *)(lVar1 + 0x44) != '\0') {
        pcVar2 = "@";
      }
      if (*(char *)(lVar1 + 0x44) == '\0') {
        local_68 = "";
      }
      else {
        local_68 = *(char **)(lVar1 + 0x58);
      }
      ly_print((lyout *)ident_local,"%s\"%s%s%s:%s\"",pcVar3,*(undefined8 *)(lVar1 + 8),pcVar2,
               local_68,**(undefined8 **)(*(long *)(first_local + 0xe) + (long)(int)mod * 8));
    }
    ly_print((lyout *)ident_local,"]");
  }
  jsons_print_text((lyout *)ident_local,"description","text",*(char **)(first_local + 2),1,
                   (int *)((long)&mod + 4));
  jsons_print_text((lyout *)ident_local,"reference","text",*(char **)(first_local + 4),1,
                   (int *)((long)&mod + 4));
  jsons_print_status((lyout *)ident_local,*(uint16_t *)(first_local + 6),(int *)((long)&mod + 4));
  jsons_print_iffeatures
            ((lyout *)ident_local,*(lys_module **)(first_local + 0xc),
             *(lys_iffeature **)(first_local + 10),*(uint8_t *)((long)first_local + 0x1b),
             (int *)((long)&mod + 4));
  ly_print((lyout *)ident_local,"}");
  if (_j != (int *)0x0) {
    *_j = 0;
  }
  return;
}

Assistant:

static void
jsons_print_identity(struct lyout *out, const struct lys_ident *ident, int *first)
{
    int f = 1, j;
    struct lys_module *mod;

    ly_print(out, "%s\"%s\":{", (first && (*first)) ? "" : ",", ident->name);
    if (ident->base_size) {
        ly_print(out, "\"bases\":[");
        f = 0;
        for (j = 0; j < ident->base_size; ++j) {
            mod = ident->base[j]->module;
            ly_print(out, "%s\"%s%s%s:%s\"", j ? "," : "",
                     mod->name, mod->rev_size ? "@" : "", mod->rev_size ? mod->rev[0].date : "",
                     ident->base[j]->name);
        }
        ly_print(out, "]");
    }
    jsons_print_text(out, "description", "text", ident->dsc, 1, &f);
    jsons_print_text(out, "reference", "text", ident->ref, 1, &f);
    jsons_print_status(out, ident->flags, &f);
    jsons_print_iffeatures(out, ident->module, ident->iffeature, ident->iffeature_size, &f);

    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }
}